

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTSerializer.cpp
# Opt level: O2

void __thiscall
slang::ast::ASTSerializer::visit<slang::ast::PatternVarSymbol>
          (ASTSerializer *this,PatternVarSymbol *elem,bool inMembersArray)

{
  SourceManager *this_00;
  size_t sVar1;
  Type *__n;
  Expression *__n_00;
  long lVar2;
  string_view sVar3;
  span<const_slang::ast::AttributeSymbol_*const,_18446744073709551615UL> sVar4;
  
  if ((elem->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.super_Symbol.kind ==
      TransparentMember) {
    return;
  }
  JsonWriter::startObject(this->writer);
  write(this,4,"name",
        (elem->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.super_Symbol.name._M_len)
  ;
  sVar3 = ast::toString((elem->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.
                        super_Symbol.kind);
  write(this,4,"kind",sVar3._M_len);
  if ((this->includeSourceInfo == true) &&
     (this_00 = this->compilation->sourceManager, this_00 != (SourceManager *)0x0)) {
    sVar3 = SourceManager::getFileName
                      (this_00,(elem->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.
                               super_Symbol.location);
    write(this,0xb,"source_file",sVar3._M_len);
    sVar1 = SourceManager::getLineNumber
                      (this_00,(elem->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.
                               super_Symbol.location);
    write(this,0xb,"source_line",sVar1);
    sVar1 = SourceManager::getColumnNumber
                      (this_00,(elem->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.
                               super_Symbol.location);
    write(this,0xd,"source_column",sVar1);
  }
  if (this->includeAddrs == true) {
    write(this,4,"addr",(size_t)elem);
  }
  sVar4 = Compilation::getAttributes(this->compilation,(Symbol *)elem);
  if (sVar4._M_extent._M_extent_value._M_extent_value != 0) {
    sVar3._M_str = "attributes";
    sVar3._M_len = 10;
    startArray(this,sVar3);
    for (lVar2 = 0; sVar4._M_extent._M_extent_value._M_extent_value << 3 != lVar2; lVar2 = lVar2 + 8
        ) {
      serialize(this,*(Symbol **)((long)sVar4._M_ptr + lVar2),false);
    }
    endArray(this);
  }
  if ((elem->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.super_Symbol.kind !=
      EnumValue) {
    __n = DeclaredType::getType
                    (&(elem->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.
                      declaredType);
    write(this,4,"type",(size_t)__n);
  }
  __n_00 = DeclaredType::getInitializer
                     (&(elem->super_TempVarSymbol).super_VariableSymbol.super_ValueSymbol.
                       declaredType);
  if (__n_00 != (Expression *)0x0) {
    write(this,0xb,"initializer",(size_t)__n_00);
  }
  JsonWriter::endObject(this->writer);
  return;
}

Assistant:

void ASTSerializer::visit(const T& elem, bool inMembersArray) {
    if constexpr (std::is_base_of_v<Expression, T> || std::is_base_of_v<Statement, T> ||
                  std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                  std::is_base_of_v<AssertionExpr, T> || std::is_base_of_v<BinsSelectExpr, T> ||
                  std::is_base_of_v<Pattern, T>) {
        writer.startObject();
        if (elem.syntax && includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                auto sr = elem.syntax->sourceRange();
                auto start = sm->getFullyExpandedLoc(sr.start());
                auto end = sm->getFullyExpandedLoc(sr.end());
                write("source_file_start", sm->getFileName(start));
                write("source_file_end", sm->getFileName(end));
                write("source_line_start", sm->getLineNumber(start));
                write("source_line_end", sm->getLineNumber(end));
                write("source_column_start", sm->getColumnNumber(start));
                write("source_column_end", sm->getColumnNumber(end));
            }
        }
    }
    if constexpr (std::is_base_of_v<Expression, T>) {
        write("kind", toString(elem.kind));
        write("type", *elem.type);
        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Expression, T>) {
            elem.serializeTo(*this);
        }

        if (tryConstantFold) {
            ASTContext ctx(compilation.getRoot(), LookupLocation::max);
            ConstantValue constant = ctx.tryEval(elem);
            if (constant)
                write("constant", constant);
        }
        else if (elem.constant) {
            write("constant", *elem.constant);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<Statement, T>) {
        write("kind", toString(elem.kind));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (!std::is_same_v<Statement, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();
    }
    else if constexpr (std::is_base_of_v<TimingControl, T> || std::is_base_of_v<Constraint, T> ||
                       std::is_base_of_v<AssertionExpr, T> ||
                       std::is_base_of_v<BinsSelectExpr, T> || std::is_base_of_v<Pattern, T>) {
        write("kind", toString(elem.kind));
        if constexpr (!std::is_same_v<TimingControl, T> && !std::is_same_v<Constraint, T> &&
                      !std::is_same_v<AssertionExpr, T> && !std::is_same_v<BinsSelectExpr, T> &&
                      !std::is_same_v<Pattern, T>) {
            elem.serializeTo(*this);
        }
        writer.endObject();
    }
    else {
        if constexpr (std::is_base_of_v<Type, T>) {
            // If we're not including detailed type info, we can just write the type name,
            // unless this a type alias, class, or covergroup. Otherwise we will fall through
            // and serialize full detailed type info.
            if (!detailedTypeInfo && (!inMembersArray || (!std::is_same_v<TypeAliasType, T> &&
                                                          !std::is_same_v<ClassType, T> &&
                                                          !std::is_same_v<CovergroupType, T>))) {
                writer.writeValue(elem.toString());
                return;
            }

            // Avoid infinite loops with recursive types.
            if (!visiting.insert(&elem).second) {
                writer.writeValue(elem.toString());
                return;
            }
        }

        // Skip uninstantiated blocks and instances.
        if constexpr (std::is_same_v<InstanceSymbol, T> ||
                      std::is_same_v<CheckerInstanceSymbol, T>) {
            if (elem.body.flags.has(InstanceFlags::Uninstantiated))
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockArraySymbol, T>) {
            if (!elem.valid)
                return;
        }
        else if constexpr (std::is_same_v<GenerateBlockSymbol, T>) {
            if (elem.isUninstantiated)
                return;
        }

        // Ignore built-in methods on class types.
        if constexpr (std::is_same_v<SubroutineSymbol, T>) {
            if (elem.flags.has(MethodFlags::BuiltIn | MethodFlags::Randomize))
                return;
        }

        // Ignore transparent members.
        if (elem.kind == SymbolKind::TransparentMember)
            return;

        writer.startObject();
        write("name", elem.name);
        write("kind", toString(elem.kind));
        if (includeSourceInfo) {
            if (auto sm = compilation.getSourceManager()) {
                write("source_file", sm->getFileName(elem.location));
                write("source_line", sm->getLineNumber(elem.location));
                write("source_column", sm->getColumnNumber(elem.location));
            }
        }

        if (includeAddrs)
            write("addr", uintptr_t(&elem));

        auto attributes = compilation.getAttributes(elem);
        if (!attributes.empty()) {
            startArray("attributes");
            for (auto attr : attributes)
                serialize(*attr);
            endArray();
        }

        if constexpr (std::is_base_of_v<ValueSymbol, T>) {
            if (elem.kind != SymbolKind::EnumValue)
                write("type", elem.getType());

            if (auto init = elem.getInitializer())
                write("initializer", *init);
        }

        if constexpr (std::is_base_of_v<Scope, T>) {
            if (!elem.empty()) {
                startArray("members");
                for (auto& member : elem.members())
                    serialize(member, /* inMembersArray */ true);
                endArray();
            }
        }

        if constexpr (!std::is_same_v<Symbol, T>) {
            elem.serializeTo(*this);
        }

        writer.endObject();

        if constexpr (std::is_base_of_v<Type, T>) {
            visiting.erase(&elem);
        }
    }
}